

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

OpacityNode * rengine::OpacityNode::create(void)

{
  bool bVar1;
  OpacityNode *t;
  Node *local_10;
  
  bVar1 = AllocationPool<rengine::OpacityNode>::isExhausted(&__allocation_pool_rengine_OpacityNode);
  if (bVar1) {
    local_10 = (Node *)operator_new(0x38);
    OpacityNode((OpacityNode *)local_10);
  }
  else {
    local_10 = &AllocationPool<rengine::OpacityNode>::allocate
                          (&__allocation_pool_rengine_OpacityNode)->super_Node;
    Node::__mark_as_pool_allocated(local_10);
  }
  return (OpacityNode *)local_10;
}

Assistant:

static OpacityNode *create(float opacity) {
        auto node = create();
        node->setOpacity(opacity);
        return node;
    }